

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O3

int __thiscall
bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>::copy
          (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  uint uVar1;
  uint uVar2;
  buf_type *__dest;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar4 = (*(int *)(dst + 0xc) - *(int *)(dst + 0x10)) + (*(uint *)(dst + 8) & 0x7fffffff);
  if (iVar4 == 0) {
    __dest = (buf_type *)0x0;
    uVar5 = 0;
  }
  else {
    uVar5 = iVar4 + 0xf;
    __dest = (buf_type *)operator_new((ulong)(uVar5 & 0xfffffff0));
    uVar5 = uVar5 & 0x7ffffff0 | 0x80000000;
  }
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ = __dest;
  *(uint *)&(this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            field_0x8 = uVar5;
  uVar1 = *(uint *)(dst + 0xc);
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ = uVar1;
  uVar6 = (uVar5 & 0x7fffffff) -
          ((*(uint *)(dst + 8) & 0x7fffffff) - *(int *)(dst + 0x10) & 0xfffffff0);
  (this->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = uVar6;
  uVar5 = *(uint *)(dst + 8);
  uVar2 = *(uint *)(dst + 0x10);
  if ((uVar5 & 0x7fffffff) == uVar2 && uVar1 == 0) {
    return uVar2;
  }
  pvVar3 = *(void **)dst;
  memcpy(__dest,pvVar3,(ulong)(uVar1 & 0xfffffff8));
  pvVar3 = memcpy(__dest + uVar6,(void *)((long)pvVar3 + (ulong)uVar2),
                  (ulong)((uVar5 & 0x7fffffff) - uVar2 & 0xfffffff0));
  return (int)pvVar3;
}

Assistant:

void left_right_sequence<L, R, i>::copy(const left_right_sequence& other) {
	size_type os = other.raw_size();
	if ( os <= base_type::inline_raw_cap ) {
		this->buf_ = this->extra();
		this->cap_ = base_type::inline_raw_cap;
		this->free_= 0;
	}
	else {
		os         = ((os + (base_type::block_size-1)) / base_type::block_size) * base_type::block_size;
		this->buf_ = (buf_type*)::operator new(os*sizeof(buf_type));
		this->cap_ = os;
		this->free_= 1;
	}
	this->left_ = other.left_;
	this->right_= this->cap_ - (other.right_size()*sizeof(right_type));
	if (!other.empty()) {
		std::memcpy(this->begin(), other.begin(), other.left_size()*sizeof(left_type));
		std::memcpy(this->right(), const_cast<left_right_sequence&>(other).right(), other.right_size()*sizeof(right_type));
	}
}